

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

int64_t helper_cvttsd2sq_x86_64(CPUX86State *env,ZMMReg *s)

{
  byte bVar1;
  byte bVar2;
  float64 a;
  int64_t iVar3;
  
  a = s->_d_ZMMReg[0];
  bVar1 = (env->sse_status).float_exception_flags;
  (env->sse_status).float_exception_flags = '\0';
  iVar3 = float64_to_int64_round_to_zero_x86_64(a,&env->sse_status);
  bVar2 = (env->sse_status).float_exception_flags;
  if ((bVar2 & 1) != 0) {
    iVar3 = -0x8000000000000000;
  }
  (env->sse_status).float_exception_flags = bVar1 | bVar2;
  return iVar3;
}

Assistant:

int64_t helper_cvttsd2sq(CPUX86State *env, ZMMReg *s)
{
    return x86_float64_to_int64_round_to_zero(s->ZMM_D(0), &env->sse_status);
}